

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

char * __thiscall cmTarget::GetProperty(cmTarget *this,string *prop,cmMakefile *context)

{
  bool bVar1;
  MessageType t;
  bool bVar2;
  __type _Var3;
  TargetType TVar4;
  int iVar5;
  PolicyStatus PVar6;
  ostream *poVar7;
  cmGeneratorTarget *pcVar8;
  long lVar9;
  size_type sVar10;
  cmTargetInternals *pcVar11;
  reference pbVar12;
  pointer pbVar13;
  size_type sVar14;
  cmSourceFile *this_00;
  string *psVar15;
  ulong uVar16;
  char *pcVar17;
  cmMakefile *pcVar18;
  cmState *this_01;
  PolicyID id;
  bool chain;
  char *retVal;
  allocator local_911;
  string local_910;
  string local_8f0 [8];
  string sname;
  cmSourceFileLocation *location;
  cmSourceFile *sf;
  string local_8a0;
  MessageType local_87c;
  undefined1 local_878 [4];
  MessageType messageType;
  ostringstream e_1;
  undefined1 local_6f8 [6];
  bool noMessage;
  bool addContent;
  string objLibName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6c8;
  const_iterator li;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string *entry;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_698;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_690;
  const_iterator i;
  char *sep;
  ostringstream ss;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_468;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_450;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_438;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_420;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_408;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_3f0;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_3d8;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_3c0;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_3a8;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_390;
  pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  local_378;
  allocator local_35b;
  allocator local_35a;
  allocator local_359;
  allocator local_358;
  allocator local_357;
  allocator local_356;
  allocator local_355;
  allocator local_354;
  allocator local_353;
  allocator local_352;
  allocator local_351;
  string local_350;
  cmGeneratorTarget *local_330;
  cmGeneratorTarget *gt_2;
  cmGlobalGenerator *gg_2;
  int local_300;
  allocator local_2f9;
  undefined1 local_2f8 [8];
  string configName_1;
  string local_2d0;
  string local_2b0;
  cmGeneratorTarget *local_290;
  cmGeneratorTarget *gt_1;
  cmGlobalGenerator *gg_1;
  string local_278;
  string local_258;
  char *local_238;
  char *configName;
  cmGeneratorTarget *gt;
  cmGlobalGenerator *gg;
  string local_218;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  cmMakefile *context_local;
  string *prop_local;
  cmTarget *this_local;
  
  TVar4 = GetType(this);
  if ((TVar4 == INTERFACE_LIBRARY) && (bVar2 = whiteListedInterfaceProperty(prop), !bVar2)) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar7 = std::operator<<((ostream *)local_1a0,
                             "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                            );
    poVar7 = std::operator<<(poVar7,(string *)prop);
    std::operator<<(poVar7,"\" is not allowed.");
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,&local_1d0,false);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    return (char *)0x0;
  }
  TVar4 = GetType(this);
  if ((((TVar4 != EXECUTABLE) && (TVar4 = GetType(this), TVar4 != STATIC_LIBRARY)) &&
      (TVar4 = GetType(this), TVar4 != SHARED_LIBRARY)) &&
     ((TVar4 = GetType(this), TVar4 != MODULE_LIBRARY &&
      (TVar4 = GetType(this), TVar4 != UNKNOWN_LIBRARY)))) goto LAB_00610d1a;
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propLOCATION_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
               "LOCATION",&local_1d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propLOCATION_abi_cxx11_);
  }
  _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                propLOCATION_abi_cxx11_);
  if (_Var3) {
    bVar2 = HandleLocationPropertyPolicy(this,context);
    if (!bVar2) {
      return (char *)0x0;
    }
    bVar2 = IsImported(this);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_218,"",(allocator *)((long)&gg + 7));
      ImportedGetFullPath(&local_1f8,this,&local_218,false);
      pcVar17 = (char *)std::__cxx11::string::c_str();
      cmPropertyMap::SetProperty
                (&this->Properties,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                 pcVar17);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gg + 7));
    }
    else {
      gt = (cmGeneratorTarget *)cmMakefile::GetGlobalGenerator(this->Makefile);
      cmGlobalGenerator::CreateGenerationObjects((cmGlobalGenerator *)gt,AllTargets);
      pcVar8 = gt;
      psVar15 = GetName_abi_cxx11_(this);
      configName = (char *)cmGlobalGenerator::FindGeneratorTarget
                                     ((cmGlobalGenerator *)pcVar8,psVar15);
      pcVar17 = cmGeneratorTarget::GetLocationForBuild((cmGeneratorTarget *)configName);
      cmPropertyMap::SetProperty
                (&this->Properties,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLOCATION_abi_cxx11_,
                 pcVar17);
    }
    goto LAB_00610d1a;
  }
  bVar2 = cmHasLiteralPrefix<std::__cxx11::string,10ul>(prop,(char (*) [10])0x989a58);
  if (bVar2) {
    bVar2 = HandleLocationPropertyPolicy(this,context);
    if (!bVar2) {
      return (char *)0x0;
    }
    lVar9 = std::__cxx11::string::c_str();
    local_238 = (char *)(lVar9 + 9);
    bVar2 = IsImported(this);
    pcVar17 = local_238;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_278,pcVar17,(allocator *)((long)&gg_1 + 7));
      ImportedGetFullPath(&local_258,this,&local_278,false);
      pcVar17 = (char *)std::__cxx11::string::c_str();
      cmPropertyMap::SetProperty(&this->Properties,prop,pcVar17);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gg_1 + 7));
    }
    else {
      gt_1 = (cmGeneratorTarget *)cmMakefile::GetGlobalGenerator(this->Makefile);
      cmGlobalGenerator::CreateGenerationObjects((cmGlobalGenerator *)gt_1,AllTargets);
      pcVar8 = gt_1;
      psVar15 = GetName_abi_cxx11_(this);
      pcVar8 = cmGlobalGenerator::FindGeneratorTarget((cmGlobalGenerator *)pcVar8,psVar15);
      pcVar17 = local_238;
      local_290 = pcVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2d0,pcVar17,(allocator *)(configName_1.field_2._M_local_buf + 0xf)
                );
      cmGeneratorTarget::GetFullPath(&local_2b0,pcVar8,&local_2d0,false,false);
      pcVar17 = (char *)std::__cxx11::string::c_str();
      cmPropertyMap::SetProperty(&this->Properties,prop,pcVar17);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)(configName_1.field_2._M_local_buf + 0xf))
      ;
    }
    goto LAB_00610d1a;
  }
  bVar2 = cmHasLiteralSuffix<std::__cxx11::string,10ul>(prop,(char (*) [10])0x989a35);
  if (!bVar2) goto LAB_00610d1a;
  pcVar17 = (char *)std::__cxx11::string::c_str();
  lVar9 = std::__cxx11::string::size();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_2f8,pcVar17,lVar9 - 9,&local_2f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2f8,"IMPORTED");
  if (bVar2) {
    bVar2 = HandleLocationPropertyPolicy(this,context);
    if (bVar2) {
      bVar2 = IsImported(this);
      if (bVar2) {
        ImportedGetFullPath((string *)&gg_2,this,(string *)local_2f8,false);
        pcVar17 = (char *)std::__cxx11::string::c_str();
        cmPropertyMap::SetProperty(&this->Properties,prop,pcVar17);
        std::__cxx11::string::~string((string *)&gg_2);
      }
      else {
        gt_2 = (cmGeneratorTarget *)cmMakefile::GetGlobalGenerator(this->Makefile);
        cmGlobalGenerator::CreateGenerationObjects((cmGlobalGenerator *)gt_2,AllTargets);
        pcVar8 = gt_2;
        psVar15 = GetName_abi_cxx11_(this);
        local_330 = cmGlobalGenerator::FindGeneratorTarget((cmGlobalGenerator *)pcVar8,psVar15);
        cmGeneratorTarget::GetFullPath(&local_350,local_330,(string *)local_2f8,false,false);
        pcVar17 = (char *)std::__cxx11::string::c_str();
        cmPropertyMap::SetProperty(&this->Properties,prop,pcVar17);
        std::__cxx11::string::~string((string *)&local_350);
      }
      goto LAB_00610cda;
    }
    this_local = (cmTarget *)0x0;
    local_300 = 1;
  }
  else {
LAB_00610cda:
    local_300 = 0;
  }
  std::__cxx11::string::~string((string *)local_2f8);
  if (local_300 != 0) {
    return (char *)this_local;
  }
LAB_00610d1a:
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   specialProps_abi_cxx11_), iVar5 != 0)) {
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::hash_set(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_);
    __cxa_atexit(cmsys::
                 hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                 ::~hash_set,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         specialProps_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propLINK_LIBRARIES_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES",&local_351);
    std::allocator<char>::~allocator((allocator<char> *)&local_351);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propLINK_LIBRARIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propTYPE_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_,
               "TYPE",&local_352);
    std::allocator<char>::~allocator((allocator<char> *)&local_352);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propINCLUDE_DIRECTORIES_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propINCLUDE_DIRECTORIES_abi_cxx11_,"INCLUDE_DIRECTORIES",&local_353);
    std::allocator<char>::~allocator((allocator<char> *)&local_353);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propINCLUDE_DIRECTORIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_FEATURES_abi_cxx11_ == '\0'
      ) && (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         propCOMPILE_FEATURES_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propCOMPILE_FEATURES_abi_cxx11_,"COMPILE_FEATURES",&local_354);
    std::allocator<char>::~allocator((allocator<char> *)&local_354);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_FEATURES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                      propCOMPILE_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_
               ,"COMPILE_OPTIONS",&local_355);
    std::allocator<char>::~allocator((allocator<char> *)&local_355);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_OPTIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_DEFINITIONS_abi_cxx11_ ==
       '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                propCOMPILE_DEFINITIONS_abi_cxx11_,"COMPILE_DEFINITIONS",&local_356);
    std::allocator<char>::~allocator((allocator<char> *)&local_356);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                  propCOMPILE_DEFINITIONS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propIMPORTED_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_,
               "IMPORTED",&local_357);
    std::allocator<char>::~allocator((allocator<char> *)&local_357);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propIMPORTED_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propNAME_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_,
               "NAME",&local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_358);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propBINARY_DIR_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propBINARY_DIR_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propBINARY_DIR_abi_cxx11_,
               "BINARY_DIR",&local_359);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propBINARY_DIR_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propBINARY_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCE_DIR_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propSOURCE_DIR_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCE_DIR_abi_cxx11_,
               "SOURCE_DIR",&local_35a);
    std::allocator<char>::~allocator((allocator<char> *)&local_35a);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCE_DIR_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propSOURCE_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                   propSOURCES_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_,
               "SOURCES",&local_35b);
    std::allocator<char>::~allocator((allocator<char> *)&local_35b);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                         propSOURCES_abi_cxx11_);
  }
  bVar2 = cmsys::
          hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::empty(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_);
  if (bVar2) {
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_378,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propLINK_LIBRARIES_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_390,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propTYPE_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_3a8,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
              propINCLUDE_DIRECTORIES_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_3c0,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_FEATURES_abi_cxx11_)
    ;
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_3d8,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propCOMPILE_OPTIONS_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_3f0,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::
              propCOMPILE_DEFINITIONS_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_408,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propIMPORTED_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_420,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propNAME_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_438,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propBINARY_DIR_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_450,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCE_DIR_abi_cxx11_);
    cmsys::
    hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::insert(&local_468,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
             &GetProperty(std::__cxx11::string_const&,cmMakefile*)::propSOURCES_abi_cxx11_);
  }
  sVar10 = cmsys::
           hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           ::count(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::specialProps_abi_cxx11_,
                   prop);
  if (sVar10 != 0) {
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propLINK_LIBRARIES_abi_cxx11_);
    if (_Var3) {
      pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar11->LinkImplementationPropertyEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         output_abi_cxx11_), iVar5 != 0)) {
          std::__cxx11::string::string
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_);
        }
        pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_488,&pcVar11->LinkImplementationPropertyEntries,";");
        std::__cxx11::string::operator=
                  ((string *)
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                   (string *)&local_488);
        std::__cxx11::string::~string((string *)&local_488);
        pcVar17 = (char *)std::__cxx11::string::c_str();
        return pcVar17;
      }
      return (char *)0x0;
    }
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propTYPE_abi_cxx11_);
    if (_Var3) {
      TVar4 = GetType(this);
      pcVar17 = cmState::GetTargetTypeName(TVar4);
      return pcVar17;
    }
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propINCLUDE_DIRECTORIES_abi_cxx11_);
    if (_Var3) {
      pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar11->IncludeDirectoriesEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         output_abi_cxx11_), iVar5 != 0)) {
          std::__cxx11::string::string
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_);
        }
        pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_4a8,&pcVar11->IncludeDirectoriesEntries,";");
        std::__cxx11::string::operator=
                  ((string *)
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                   (string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_4a8);
        pcVar17 = (char *)std::__cxx11::string::c_str();
        return pcVar17;
      }
      return (char *)0x0;
    }
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propCOMPILE_FEATURES_abi_cxx11_);
    if (_Var3) {
      pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar11->CompileFeaturesEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         output_abi_cxx11_), iVar5 != 0)) {
          std::__cxx11::string::string
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_);
        }
        pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_4c8,&pcVar11->CompileFeaturesEntries,";");
        std::__cxx11::string::operator=
                  ((string *)
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                   (string *)&local_4c8);
        std::__cxx11::string::~string((string *)&local_4c8);
        pcVar17 = (char *)std::__cxx11::string::c_str();
        return pcVar17;
      }
      return (char *)0x0;
    }
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propCOMPILE_OPTIONS_abi_cxx11_);
    if (_Var3) {
      pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar11->CompileOptionsEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         output_abi_cxx11_), iVar5 != 0)) {
          std::__cxx11::string::string
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_);
        }
        pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_4e8,&pcVar11->CompileOptionsEntries,";");
        std::__cxx11::string::operator=
                  ((string *)
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                   (string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_4e8);
        pcVar17 = (char *)std::__cxx11::string::c_str();
        return pcVar17;
      }
      return (char *)0x0;
    }
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propCOMPILE_DEFINITIONS_abi_cxx11_);
    if (_Var3) {
      pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar11->CompileDefinitionsEntries);
      if (!bVar2) {
        if ((GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_ == '\0') &&
           (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                         output_abi_cxx11_), iVar5 != 0)) {
          std::__cxx11::string::string
                    ((string *)
                     &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                               output_abi_cxx11_);
        }
        pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_508,&pcVar11->CompileDefinitionsEntries,";");
        std::__cxx11::string::operator=
                  ((string *)
                   &GetProperty(std::__cxx11::string_const&,cmMakefile*)::output_abi_cxx11_,
                   (string *)&local_508);
        std::__cxx11::string::~string((string *)&local_508);
        pcVar17 = (char *)std::__cxx11::string::c_str();
        return pcVar17;
      }
      return (char *)0x0;
    }
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propIMPORTED_abi_cxx11_);
    if (_Var3) {
      bVar2 = IsImported(this);
      if (!bVar2) {
        return "FALSE";
      }
      return "TRUE";
    }
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propNAME_abi_cxx11_);
    if (_Var3) {
      GetName_abi_cxx11_(this);
      pcVar17 = (char *)std::__cxx11::string::c_str();
      return pcVar17;
    }
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propBINARY_DIR_abi_cxx11_);
    if (_Var3) {
      pcVar18 = GetMakefile(this);
      pcVar17 = cmMakefile::GetCurrentBinaryDirectory(pcVar18);
      return pcVar17;
    }
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propSOURCE_DIR_abi_cxx11_);
    if (_Var3) {
      pcVar18 = GetMakefile(this);
      pcVar17 = cmMakefile::GetCurrentSourceDirectory(pcVar18);
      return pcVar17;
    }
    _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&,cmMakefile*)::
                                  propSOURCES_abi_cxx11_);
    if (_Var3) {
      pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pcVar11->SourceEntries);
      if (bVar2) {
        return (char *)0x0;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&sep);
      i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9c7e13;
      pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
      local_698._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&pcVar11->SourceEntries);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_690,&local_698);
      while( true ) {
        pcVar11 = cmTargetInternalPointer::operator->(&this->Internal);
        entry = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&pcVar11->SourceEntries);
        bVar2 = __gnu_cxx::operator!=
                          (&local_690,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&entry);
        if (!bVar2) break;
        pbVar12 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_690);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&li);
        cmSystemTools::ExpandListArgument
                  (pbVar12,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&li,false);
        local_6d0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&li);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_6c8,&local_6d0);
        while( true ) {
          objLibName.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&li);
          bVar2 = __gnu_cxx::operator!=
                            (&local_6c8,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&objLibName.field_2 + 8));
          if (!bVar2) break;
          pbVar12 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_6c8);
          bVar2 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                            (pbVar12,(char (*) [18])"$<TARGET_OBJECTS:");
          if (bVar2) {
            pbVar12 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_6c8);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->(&local_6c8);
            std::__cxx11::string::size();
            pcVar17 = (char *)std::__cxx11::string::operator[]((ulong)pbVar12);
            if (*pcVar17 != '>') goto LAB_006121af;
            pbVar13 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator->(&local_6c8);
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->(&local_6c8);
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_6f8,(ulong)pbVar13);
            sVar14 = cmGeneratorExpression::Find((string *)local_6f8);
            if (sVar14 == 0xffffffffffffffff) {
              bVar1 = false;
              bVar2 = true;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_878);
              local_87c = AUTHOR_WARNING;
              PVar6 = cmMakefile::GetPolicyStatus(context,CMP0051);
              if (PVar6 != OLD) {
                if (PVar6 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_8a0,(cmPolicies *)0x33,id);
                  poVar7 = std::operator<<((ostream *)local_878,(string *)&local_8a0);
                  std::operator<<(poVar7,"\n");
                  std::__cxx11::string::~string((string *)&local_8a0);
                  bVar2 = false;
                }
                else if (PVar6 - NEW < 3) {
                  bVar1 = true;
                }
              }
              if (!bVar2) {
                poVar7 = std::operator<<((ostream *)local_878,"Target \"");
                poVar7 = std::operator<<(poVar7,(string *)&this->Name);
                std::operator<<(poVar7,
                                "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                               );
                t = local_87c;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage(context,t,(string *)&sf,false);
                std::__cxx11::string::~string((string *)&sf);
              }
              if (bVar1) {
                std::operator<<((ostream *)&sep,(char *)i._M_current);
                i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x982206;
                pbVar12 = __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_6c8);
                std::operator<<((ostream *)&sep,(string *)pbVar12);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_878);
              local_300 = 0;
            }
            else {
              std::operator<<((ostream *)&sep,(char *)i._M_current);
              i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x982206;
              pbVar12 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_6c8);
              std::operator<<((ostream *)&sep,(string *)pbVar12);
              local_300 = 7;
            }
            std::__cxx11::string::~string((string *)local_6f8);
          }
          else {
LAB_006121af:
            pbVar12 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_6c8);
            sVar14 = cmGeneratorExpression::Find(pbVar12);
            if (sVar14 == 0xffffffffffffffff) {
              std::operator<<((ostream *)&sep,(char *)i._M_current);
              i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x982206;
              pbVar12 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_6c8);
              std::operator<<((ostream *)&sep,(string *)pbVar12);
            }
            else {
              pcVar18 = this->Makefile;
              pbVar12 = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_6c8);
              this_00 = cmMakefile::GetOrCreateSource(pcVar18,pbVar12,false);
              sname.field_2._8_8_ = cmSourceFile::GetLocation(this_00);
              psVar15 = cmSourceFileLocation::GetDirectory_abi_cxx11_
                                  ((cmSourceFileLocation *)sname.field_2._8_8_);
              std::__cxx11::string::string(local_8f0,(string *)psVar15);
              uVar16 = std::__cxx11::string::empty();
              if ((uVar16 & 1) == 0) {
                std::__cxx11::string::operator+=(local_8f0,"/");
              }
              psVar15 = cmSourceFileLocation::GetName_abi_cxx11_
                                  ((cmSourceFileLocation *)sname.field_2._8_8_);
              std::__cxx11::string::operator+=(local_8f0,(string *)psVar15);
              std::operator<<((ostream *)&sep,(char *)i._M_current);
              i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x982206;
              std::operator<<((ostream *)&sep,local_8f0);
              std::__cxx11::string::~string(local_8f0);
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_6c8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&li);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_690);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_910,"SOURCES",&local_911);
      std::__cxx11::ostringstream::str();
      pcVar17 = (char *)std::__cxx11::string::c_str();
      cmPropertyMap::SetProperty(&this->Properties,&local_910,pcVar17);
      std::__cxx11::string::~string((string *)&retVal);
      std::__cxx11::string::~string((string *)&local_910);
      std::allocator<char>::~allocator((allocator<char> *)&local_911);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sep);
    }
  }
  this_local = (cmTarget *)cmPropertyMap::GetPropertyValue(&this->Properties,prop);
  if (this_local == (cmTarget *)0x0) {
    pcVar18 = GetMakefile(this);
    this_01 = cmMakefile::GetState(pcVar18);
    bVar2 = cmState::IsPropertyChained(this_01,prop,TARGET);
    if (bVar2) {
      this_local = (cmTarget *)cmMakefile::GetProperty(this->Makefile,prop,bVar2);
    }
  }
  return (char *)this_local;
}

Assistant:

const char *cmTarget::GetProperty(const std::string& prop,
                                  cmMakefile* context) const
{
  if (this->GetType() == cmState::INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    context->IssueMessage(cmake::FATAL_ERROR, e.str());
    return 0;
    }

  // Watch for special "computed" properties that are dependent on
  // other properties or variables.  Always recompute them.
  if(this->GetType() == cmState::EXECUTABLE ||
     this->GetType() == cmState::STATIC_LIBRARY ||
     this->GetType() == cmState::SHARED_LIBRARY ||
     this->GetType() == cmState::MODULE_LIBRARY ||
     this->GetType() == cmState::UNKNOWN_LIBRARY)
    {
    static const std::string propLOCATION = "LOCATION";
    if(prop == propLOCATION)
      {
      if (!this->HandleLocationPropertyPolicy(context))
        {
        return 0;
        }

      // Set the LOCATION property of the target.
      //
      // For an imported target this is the location of an arbitrary
      // available configuration.
      //
      if(this->IsImported())
        {
        this->Properties.SetProperty(
                propLOCATION, this->ImportedGetFullPath("", false).c_str());
        }
      else
        {
        // For a non-imported target this is deprecated because it
        // cannot take into account the per-configuration name of the
        // target because the configuration type may not be known at
        // CMake time.
        cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
        gg->CreateGenerationObjects();
        cmGeneratorTarget* gt = gg->FindGeneratorTarget(this->GetName());
        this->Properties.SetProperty(propLOCATION,
                                     gt->GetLocationForBuild());
        }

      }

    // Support "LOCATION_<CONFIG>".
    else if(cmHasLiteralPrefix(prop, "LOCATION_"))
      {
      if (!this->HandleLocationPropertyPolicy(context))
        {
        return 0;
        }
      const char* configName = prop.c_str() + 9;

      if (this->IsImported())
        {
        this->Properties.SetProperty(
                prop, this->ImportedGetFullPath(configName, false).c_str());
        }
      else
        {
        cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
        gg->CreateGenerationObjects();
        cmGeneratorTarget* gt = gg->FindGeneratorTarget(this->GetName());
        this->Properties.SetProperty(
                prop, gt->GetFullPath(configName, false).c_str());
        }
      }
    // Support "<CONFIG>_LOCATION".
    else if(cmHasLiteralSuffix(prop, "_LOCATION"))
      {
      std::string configName(prop.c_str(), prop.size() - 9);
      if(configName != "IMPORTED")
        {
        if (!this->HandleLocationPropertyPolicy(context))
          {
          return 0;
          }
        if (this->IsImported())
          {
          this->Properties.SetProperty(
                  prop, this->ImportedGetFullPath(configName, false).c_str());
          }
        else
          {
          cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
          gg->CreateGenerationObjects();
          cmGeneratorTarget* gt = gg->FindGeneratorTarget(this->GetName());
          this->Properties.SetProperty(
                  prop, gt->GetFullPath(configName, false).c_str());
          }
        }
      }
    }
  static UNORDERED_SET<std::string> specialProps;
#define MAKE_STATIC_PROP(PROP) \
  static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(TYPE);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(IMPORTED);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(BINARY_DIR);
  MAKE_STATIC_PROP(SOURCE_DIR);
  MAKE_STATIC_PROP(SOURCES);
#undef MAKE_STATIC_PROP
  if(specialProps.empty())
    {
    specialProps.insert(propLINK_LIBRARIES);
    specialProps.insert(propTYPE);
    specialProps.insert(propINCLUDE_DIRECTORIES);
    specialProps.insert(propCOMPILE_FEATURES);
    specialProps.insert(propCOMPILE_OPTIONS);
    specialProps.insert(propCOMPILE_DEFINITIONS);
    specialProps.insert(propIMPORTED);
    specialProps.insert(propNAME);
    specialProps.insert(propBINARY_DIR);
    specialProps.insert(propSOURCE_DIR);
    specialProps.insert(propSOURCES);
    }
  if(specialProps.count(prop))
    {
    if(prop == propLINK_LIBRARIES)
      {
      if (this->Internal->LinkImplementationPropertyEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->LinkImplementationPropertyEntries, ";");
      return output.c_str();
      }
    // the type property returns what type the target is
    else if (prop == propTYPE)
      {
      return cmState::GetTargetTypeName(this->GetType());
      }
    else if(prop == propINCLUDE_DIRECTORIES)
      {
      if (this->Internal->IncludeDirectoriesEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->IncludeDirectoriesEntries, ";");
      return output.c_str();
      }
    else if(prop == propCOMPILE_FEATURES)
      {
      if (this->Internal->CompileFeaturesEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->CompileFeaturesEntries, ";");
      return output.c_str();
      }
    else if(prop == propCOMPILE_OPTIONS)
      {
      if (this->Internal->CompileOptionsEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->CompileOptionsEntries, ";");
      return output.c_str();
      }
    else if(prop == propCOMPILE_DEFINITIONS)
      {
      if (this->Internal->CompileDefinitionsEntries.empty())
        {
        return 0;
        }

      static std::string output;
      output = cmJoin(this->Internal->CompileDefinitionsEntries, ";");
      return output.c_str();
      }
    else if (prop == propIMPORTED)
      {
      return this->IsImported()?"TRUE":"FALSE";
      }
    else if (prop == propNAME)
      {
      return this->GetName().c_str();
      }
    else if (prop == propBINARY_DIR)
      {
      return this->GetMakefile()->GetCurrentBinaryDirectory();
      }
    else if (prop == propSOURCE_DIR)
      {
      return this->GetMakefile()->GetCurrentSourceDirectory();
      }
    else if(prop == propSOURCES)
      {
      if (this->Internal->SourceEntries.empty())
        {
        return 0;
        }

      std::ostringstream ss;
      const char* sep = "";
      for(std::vector<std::string>::const_iterator
            i = this->Internal->SourceEntries.begin();
          i != this->Internal->SourceEntries.end(); ++i)
        {
        std::string const& entry = *i;

        std::vector<std::string> files;
        cmSystemTools::ExpandListArgument(entry, files);
        for (std::vector<std::string>::const_iterator
            li = files.begin(); li != files.end(); ++li)
          {
          if(cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
              (*li)[li->size() - 1] == '>')
            {
            std::string objLibName = li->substr(17, li->size()-18);

            if (cmGeneratorExpression::Find(objLibName) != std::string::npos)
              {
              ss << sep;
              sep = ";";
              ss << *li;
              continue;
              }

            bool addContent = false;
            bool noMessage = true;
            std::ostringstream e;
            cmake::MessageType messageType = cmake::AUTHOR_WARNING;
            switch(context->GetPolicyStatus(cmPolicies::CMP0051))
              {
              case cmPolicies::WARN:
                e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
                noMessage = false;
              case cmPolicies::OLD:
                break;
              case cmPolicies::REQUIRED_ALWAYS:
              case cmPolicies::REQUIRED_IF_USED:
              case cmPolicies::NEW:
                addContent = true;
              }
            if (!noMessage)
              {
              e << "Target \"" << this->Name << "\" contains "
              "$<TARGET_OBJECTS> generator expression in its sources list.  "
              "This content was not previously part of the SOURCES property "
              "when that property was read at configure time.  Code reading "
              "that property needs to be adapted to ignore the generator "
              "expression using the string(GENEX_STRIP) command.";
              context->IssueMessage(messageType, e.str());
              }
            if (addContent)
              {
              ss << sep;
              sep = ";";
              ss << *li;
              }
            }
          else if (cmGeneratorExpression::Find(*li) == std::string::npos)
            {
            ss << sep;
            sep = ";";
            ss << *li;
            }
          else
            {
            cmSourceFile *sf = this->Makefile->GetOrCreateSource(*li);
            // Construct what is known about this source file location.
            cmSourceFileLocation const& location = sf->GetLocation();
            std::string sname = location.GetDirectory();
            if(!sname.empty())
              {
              sname += "/";
              }
            sname += location.GetName();

            ss << sep;
            sep = ";";
            // Append this list entry.
            ss << sname;
            }
          }
        }
      this->Properties.SetProperty("SOURCES", ss.str().c_str());
      }
    }

  const char *retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal)
    {
    const bool chain = this->GetMakefile()->GetState()->
                      IsPropertyChained(prop, cmProperty::TARGET);
    if (chain)
      {
      return this->Makefile->GetProperty(prop, chain);
      }
    }
  return retVal;
}